

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contour_correspondence.hpp
# Opt level: O3

ModelContour *
eos::fitting::ModelContour::load(ModelContour *__return_storage_ptr__,string *filename)

{
  size_t *psVar1;
  pointer pIVar2;
  runtime_error *this;
  JSONInputArchive input_archive;
  ifstream file;
  JSONInputArchive JStack_3f8;
  long local_228 [4];
  byte abStack_208 [488];
  
  (__return_storage_ptr__->left_contour).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->left_contour).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->right_contour).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->left_contour).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->right_contour).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->right_contour).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::ifstream::ifstream(local_228,(string *)filename,_S_in);
  if ((abStack_208[*(long *)(local_228[0] + -0x18)] & 5) == 0) {
    cereal::JSONInputArchive::JSONInputArchive(&JStack_3f8,(istream *)local_228);
    cereal::JSONInputArchive::startNode
              (JStack_3f8.super_InputArchive<cereal::JSONInputArchive,_0U>.self);
    serialize<cereal::JSONInputArchive>
              (__return_storage_ptr__,
               ((JStack_3f8.super_InputArchive<cereal::JSONInputArchive,_0U>.self)->
               super_InputArchive<cereal::JSONInputArchive,_0U>).self);
    pIVar2 = ((JStack_3f8.super_InputArchive<cereal::JSONInputArchive,_0U>.self)->itsIteratorStack).
             super__Vector_base<cereal::JSONInputArchive::Iterator,_std::allocator<cereal::JSONInputArchive::Iterator>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    ((JStack_3f8.super_InputArchive<cereal::JSONInputArchive,_0U>.self)->itsIteratorStack).
    super__Vector_base<cereal::JSONInputArchive::Iterator,_std::allocator<cereal::JSONInputArchive::Iterator>_>
    ._M_impl.super__Vector_impl_data._M_finish = pIVar2 + -1;
    psVar1 = &pIVar2[-2].itsIndex;
    *psVar1 = *psVar1 + 1;
    cereal::JSONInputArchive::~JSONInputArchive(&JStack_3f8);
    std::ifstream::~ifstream(local_228);
    return __return_storage_ptr__;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&JStack_3f8,
                 "Error opening given file: ",filename);
  std::runtime_error::runtime_error(this,(string *)&JStack_3f8);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static ModelContour load(std::string filename)
    {
        ModelContour contour;

        std::ifstream file(filename);
        if (!file)
        {
            throw std::runtime_error("Error opening given file: " + filename);
        }
        cereal::JSONInputArchive input_archive(file);
        input_archive(contour);

        return contour;
    }